

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsprg.cpp
# Opt level: O2

void __thiscall CTcParser::parse_enum(CTcParser *this,int *err)

{
  CVmHashEntry **ppCVar1;
  char *str;
  size_t len;
  ulong id;
  bool bVar2;
  int iVar3;
  tc_toktyp_t tVar4;
  CTcSymbol *pCVar5;
  CTcSymEnum *this_00;
  int is_token;
  textchar_t *sym;
  
  CTcTokenizer::next(G_tok);
  is_token = 0;
  bVar2 = true;
  if (((G_tok->curtok_).typ_ == TOKT_SYM) &&
     (iVar3 = CTcTokenizer::cur_tok_matches(G_tok,"token",5), iVar3 != 0)) {
    CTcTokenizer::next(G_tok);
    is_token = 1;
    bVar2 = false;
  }
  do {
    tVar4 = (G_tok->curtok_).typ_;
    if (tVar4 == TOKT_SYM) {
      sym = (G_tok->curtok_).text_;
      pCVar5 = CTcPrsSymtab::find(this->global_symtab_,sym,(G_tok->curtok_).text_len_);
      if (pCVar5 == (CTcSymbol *)0x0) {
        this_00 = (CTcSymEnum *)CTcSymbolBase::operator_new((CTcSymbolBase *)0x38,(size_t)sym);
        str = (G_tok->curtok_).text_;
        len = (G_tok->curtok_).text_len_;
        id = this->next_enum_id_;
        this->next_enum_id_ = id + 1;
        CTcSymEnum::CTcSymEnum(this_00,str,len,0,id,is_token);
        (*this->global_symtab_->_vptr_CTcPrsSymtab[3])(this->global_symtab_,this_00);
        (*(this_00->super_CTcSymEnumBase).super_CTcSymbol.super_CTcSymbolBase.super_CVmHashEntryCS.
          super_CVmHashEntry._vptr_CVmHashEntry[0xf])(this_00);
      }
      else if (*(int *)&(pCVar5->super_CTcSymbolBase).super_CVmHashEntryCS.super_CVmHashEntry.
                        field_0x24 == 10) {
        if (!bVar2) {
          ppCVar1 = &pCVar5[1].super_CTcSymbolBase.super_CVmHashEntryCS.super_CVmHashEntry.nxt_;
          *(byte *)ppCVar1 = *(byte *)ppCVar1 | 1;
        }
      }
      else {
        CTcTokenizer::log_error_curtok(G_tok,0x2b8a);
      }
      tVar4 = CTcTokenizer::next(G_tok);
      if (tVar4 != TOKT_COMMA) {
        if ((tVar4 - TOKT_LBRACE < 2) || (tVar4 == TOKT_EOF)) goto LAB_001e0821;
        if (tVar4 != TOKT_SEM) {
          iVar3 = 0x2b8b;
          goto LAB_001e080a;
        }
        goto LAB_001e083e;
      }
    }
    else {
      if ((tVar4 - TOKT_LBRACE < 2) || (tVar4 == TOKT_EOF)) {
LAB_001e0821:
        CTcTokenizer::log_error_curtok(G_tok,0x2b07);
        return;
      }
      iVar3 = 0x2b89;
      if (tVar4 == TOKT_SEM) {
        CTcTokenizer::log_error_curtok(G_tok,0x2b89);
LAB_001e083e:
        CTcTokenizer::next(G_tok);
        return;
      }
LAB_001e080a:
      CTcTokenizer::log_error_curtok(G_tok,iVar3);
    }
    CTcTokenizer::next(G_tok);
  } while( true );
}

Assistant:

void CTcParser::parse_enum(int *err)
{
    int done;
    int is_token;

    /* presume it's not a 'token' enum */
    is_token = FALSE;
    
    /* skip the 'enum' token */
    G_tok->next();

    /* 
     *   if this is the 'token' context-sensitive keyword, note it and
     *   skip it 
     */
    if (G_tok->cur() == TOKT_SYM && G_tok->cur_tok_matches("token", 5))
    {
        /* remember that it's a 'token' enum */
        is_token = TRUE;

        /* skip the keyword */
        G_tok->next();
    }

    /* parse enum constants */
    for (done = FALSE ; !done ; )
    {
        CTcSymEnum *sym;
        
        switch (G_tok->cur())
        {
        case TOKT_SYM:
            /* make sure the symbol isn't already defined */
            sym = (CTcSymEnum *)
                  global_symtab_->find(G_tok->getcur()->get_text(),
                                       G_tok->getcur()->get_text_len());

            /* if it's already defined, make sure it's an enum */
            if (sym != 0)
            {
                /* if it's not an enum, it's an error */
                if (sym->get_type() != TC_SYM_ENUM)
                {
                    /* log the error */
                    G_tok->log_error_curtok(TCERR_REDEF_AS_ENUM);
                }
                else if (is_token)
                {
                    /* 
                     *   we're defining a token - mark the old symbol as a
                     *   token if it wasn't already 
                     */
                    sym->set_is_token(TRUE);
                }
            }
            else
            {
                /* create the new symbol */
                sym = new CTcSymEnum(G_tok->getcur()->get_text(),
                                     G_tok->getcur()->get_text_len(),
                                     FALSE, new_enum_id(), is_token);

                /* add it to the symbol table */
                global_symtab_->add_entry(sym);

                /* mark it as referenced, since it's defined here */
                sym->mark_referenced();
            }

            /* skip the symbol name and see what follows */
            switch(G_tok->next())
            {
            case TOKT_COMMA:
                /* skip the comma and keep going */
                G_tok->next();
                break;
                
            case TOKT_SEM:
                /* end of the statement */
                done = TRUE;
                G_tok->next();
                break;

            case TOKT_LBRACE:
            case TOKT_RBRACE:
            case TOKT_EOF:
                /* they probably omitted the closing semicolon */
                G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
                done = TRUE;
                break;

            default:
                /* a comma was required */
                G_tok->log_error_curtok(TCERR_ENUM_REQ_COMMA);

                /* skip the offending symbol and proceed */
                G_tok->next();
                break;
            }

            /* done with this token */
            break;

        case TOKT_LBRACE:
        case TOKT_RBRACE:
        case TOKT_EOF:
            /* 
             *   they probably omitted the closing semicolon - log an
             *   error, then stop scanning the statement, since we're
             *   probably in the next statement already 
             */
            G_tok->log_error_curtok(TCERR_EXPECTED_SEMI);
            done = TRUE;
            break;

        case TOKT_SEM:
            /* they must have left out a symbol */
            G_tok->log_error_curtok(TCERR_ENUM_REQ_SYM);

            /* accept the semicolon as the end of the statement */
            G_tok->next();
            done = TRUE;
            break;
            
        default:
            /* anything else is an error */
            G_tok->log_error_curtok(TCERR_ENUM_REQ_SYM);

            /* skip the offending token and keep parsing */
            G_tok->next();
            break;
        }
    }
}